

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
LDPC4QKD::HelpersReadFilesLDPC::helper_parse_sep_ints<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *in,
          char delimiter)

{
  pointer pcVar1;
  long lVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  longlong lVar6;
  uint local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = __return_storage_ptr__;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(in," \t\n\r\f\v",0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (in,sVar4 + 1,0xffffffffffffffff);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of(in," \t\n\r\f\v",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase(in,0,sVar4)
  ;
  sVar4 = 0;
  while (sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(in,delimiter,sVar4), this = local_58, sVar5 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,in,sVar4,sVar5 - sVar4);
    lVar6 = std::__cxx11::stoll(&local_50,(size_t *)0x0,10);
    local_5c = (uint)lVar6;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this,&local_5c);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar1 = (in->_M_dataplus)._M_p;
    do {
      lVar2 = sVar5 + 1;
      sVar5 = sVar5 + 1;
      iVar3 = isspace((int)pcVar1[lVar2]);
      sVar4 = sVar5;
    } while (iVar3 != 0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_50,in,sVar4,0xffffffffffffffff);
  lVar6 = std::__cxx11::stoll(&local_50,(size_t *)0x0,10);
  local_5c = (uint)lVar6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this,&local_5c);
  std::__cxx11::string::~string((string *)&local_50);
  return this;
}

Assistant:

std::vector<idx_t> helper_parse_sep_ints(std::string &in, const char delimiter) {
            std::vector <idx_t> ret;

            std::size_t start = 0;
            std::size_t end = 0;
            constexpr auto trimmed_whitespace = " \t\n\r\f\v";

            // trim leading and trailing whitespace
            in.erase(in.find_last_not_of(trimmed_whitespace) + 1);
            in.erase(0, in.find_first_not_of(trimmed_whitespace));

            while (std::string::npos != (end = in.find(delimiter, start))) {
                ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start, end - start))));
                start = end + 1;
                while (::isspace(in[start]))
                    ++start;
            }
            ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start))));
            return ret;
        }